

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# predicates.cxx
# Opt level: O2

double orient2dadapt(double *pa,double *pb,double *pc,double detsum)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  double dVar5;
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  double dVar8;
  undefined4 extraout_EAX;
  int iVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dVar21;
  double dVar22;
  double dVar23;
  double dVar24;
  double dVar25;
  double dVar26;
  double dVar27;
  double dVar28;
  double dVar29;
  double dVar30;
  double dVar31;
  double dVar32;
  double dStack_240;
  double dStack_200;
  double dStack_1e0;
  double dStack_1c0;
  double local_188;
  double dStack_180;
  double local_178;
  double dStack_170;
  double local_168;
  double dStack_160;
  double local_158;
  double dStack_150;
  double D [16];
  double C1 [8];
  double C2 [12];
  
  dVar17 = splitter;
  dVar32 = *pa;
  dVar5 = pa[1];
  auVar1 = *(undefined1 (*) [16])pc;
  dVar20 = auVar1._0_8_;
  dVar28 = dVar32 - dVar20;
  dVar22 = auVar1._8_8_;
  dVar24 = dVar5 - dVar22;
  dVar8 = *pb;
  dVar12 = pb[1];
  auVar2._8_4_ = auVar1._0_4_;
  auVar2._0_8_ = dVar22;
  auVar2._12_4_ = auVar1._4_4_;
  dVar23 = dVar12 - dVar22;
  dVar25 = dVar8 - dVar20;
  dVar30 = splitter * dVar23 - (splitter * dVar23 - dVar23);
  dVar31 = splitter * dVar25 - (splitter * dVar25 - dVar25);
  dVar27 = dVar23 - dVar30;
  dVar29 = dVar25 - dVar31;
  auVar1._8_4_ = SUB84(splitter,0);
  auVar1._0_8_ = splitter;
  auVar1._12_4_ = (int)((ulong)splitter >> 0x20);
  dVar18 = dVar28 * splitter - (dVar28 * splitter - dVar28);
  dVar21 = dVar24 * splitter - (dVar24 * splitter - dVar24);
  dVar13 = dVar28 - dVar18;
  dVar15 = dVar24 - dVar21;
  auVar6._8_4_ = SUB84(dVar24,0);
  auVar6._0_8_ = dVar28;
  auVar6._12_4_ = (int)((ulong)dVar24 >> 0x20);
  dVar11 = dVar23 * dVar28;
  dVar24 = dVar25 * dVar24;
  dVar14 = dVar13 * dVar27 - (((dVar11 - dVar18 * dVar30) - dVar13 * dVar30) - dVar18 * dVar27);
  dVar16 = dVar15 * dVar29 - (((dVar24 - dVar21 * dVar31) - dVar15 * dVar31) - dVar21 * dVar29);
  dVar19 = dVar14 - dVar16;
  dVar10 = dVar11 + dVar19;
  dVar11 = (dVar11 - (dVar10 - (dVar10 - dVar11))) + (dVar19 - (dVar10 - dVar11));
  dVar26 = dVar11 - dVar24;
  local_188 = (dVar14 - (dVar19 + (dVar14 - dVar19))) + ((dVar14 - dVar19) - dVar16);
  dStack_180 = (dVar11 - (dVar26 + (dVar11 - dVar26))) + ((dVar11 - dVar26) - dVar24);
  dStack_170 = dVar10 + dVar26;
  local_178 = (dVar10 - (dStack_170 - (dStack_170 - dVar10))) + (dVar26 - (dStack_170 - dVar10));
  dVar11 = estimate(4,&local_188);
  if (dVar11 < ccwerrboundB * detsum) {
    if (-dVar11 < ccwerrboundB * detsum) {
      dStack_1e0 = auVar6._8_8_;
      dVar24 = (dVar32 - (dVar28 + (dVar32 - dVar28))) + ((dVar32 - dVar28) - dVar20);
      dVar26 = (dVar5 - (dStack_1e0 + (dVar5 - dStack_1e0))) + ((dVar5 - dStack_1e0) - dVar22);
      dStack_200 = auVar2._8_8_;
      dVar20 = (dVar12 - (dVar23 + (dVar12 - dVar23))) + ((dVar12 - dVar23) - dVar22);
      dVar22 = (dVar8 - (dVar25 + (dVar8 - dVar25))) + ((dVar8 - dVar25) - dStack_200);
      auVar3._4_4_ = -(uint)(dVar26 != 0.0);
      auVar3._0_4_ = -(uint)(dVar24 != 0.0);
      auVar3._8_4_ = -(uint)(dVar20 != 0.0);
      auVar3._12_4_ = -(uint)(dVar22 != 0.0);
      iVar9 = movmskps(extraout_EAX,auVar3);
      if (iVar9 != 0) {
        dVar32 = detsum * ccwerrboundC + ABS(dVar11) * resulterrbound;
        dVar23 = dVar23 * dVar24;
        dVar25 = dVar25 * dVar26;
        dVar28 = dVar28 * dVar20;
        dStack_1e0 = dStack_1e0 * dVar22;
        dVar11 = dVar11 + ((dVar28 + dVar23) - (dStack_1e0 + dVar25));
        if ((dVar11 < dVar32) && (-dVar11 < dVar32)) {
          dStack_240 = auVar1._8_8_;
          dVar11 = dVar17 * dVar24;
          dVar11 = dVar11 - (dVar11 - dVar24);
          dVar32 = dStack_240 * dVar26 - (dStack_240 * dVar26 - dVar26);
          dVar14 = dVar24 - dVar11;
          dVar19 = dVar26 - dVar32;
          auVar4._8_4_ = SUB84(dVar32,0);
          auVar4._0_8_ = dVar11;
          auVar4._12_4_ = (int)((ulong)dVar32 >> 0x20);
          dVar10 = dVar27 * dVar14 -
                   (((dVar23 - dVar11 * dVar30) - dVar30 * dVar14) - dVar11 * dVar27);
          dVar16 = dVar29 * dVar19 -
                   (((dVar25 - dVar32 * dVar31) - dVar31 * dVar19) - dVar32 * dVar29);
          dVar8 = dVar10 - dVar16;
          dVar12 = dVar23 + dVar8;
          dVar32 = (dVar23 - (dVar12 - (dVar12 - dVar23))) + (dVar8 - (dVar12 - dVar23));
          dVar5 = dVar32 - dVar25;
          local_168 = (dVar10 - (dVar8 + (dVar10 - dVar8))) + ((dVar10 - dVar8) - dVar16);
          dStack_160 = (dVar32 - (dVar5 + (dVar32 - dVar5))) + ((dVar32 - dVar5) - dVar25);
          dStack_150 = dVar12 + dVar5;
          local_158 = (dVar12 - (dStack_150 - (dStack_150 - dVar12))) +
                      (dVar5 - (dStack_150 - dVar12));
          iVar9 = fast_expansion_sum_zeroelim(4,&local_188,4,&local_168,C1);
          dVar17 = dVar17 * dVar20;
          dVar17 = dVar17 - (dVar17 - dVar20);
          dVar5 = dStack_240 * dVar22 - (dStack_240 * dVar22 - dVar22);
          auVar7._8_4_ = SUB84(dVar5,0);
          auVar7._0_8_ = dVar17;
          auVar7._12_4_ = (int)((ulong)dVar5 >> 0x20);
          dVar16 = dVar20 - dVar17;
          dVar23 = dVar22 - dVar5;
          dVar32 = dVar13 * dVar16 -
                   (-dVar18 * dVar16 + -dVar13 * dVar17 + -dVar18 * dVar17 + dVar28);
          dVar8 = dVar15 * dVar23 -
                  (-dVar21 * dVar23 + -dVar15 * dVar5 + -dVar21 * dVar5 + dStack_1e0);
          dVar12 = dVar32 - dVar8;
          dVar10 = dVar28 + dVar12;
          dVar28 = (dVar28 - (dVar10 - (dVar10 - dVar28))) + (dVar12 - (dVar10 - dVar28));
          dVar5 = dVar28 - dStack_1e0;
          local_168 = (dVar32 - (dVar12 + (dVar32 - dVar12))) + ((dVar32 - dVar12) - dVar8);
          dStack_160 = (dVar28 - (dVar5 + (dVar28 - dVar5))) + ((dVar28 - dVar5) - dStack_1e0);
          dStack_150 = dVar10 + dVar5;
          local_158 = (dVar10 - (dStack_150 - (dStack_150 - dVar10))) +
                      (dVar5 - (dStack_150 - dVar10));
          iVar9 = fast_expansion_sum_zeroelim(iVar9,C1,4,&local_168,C2);
          dVar20 = dVar20 * dVar24;
          dVar22 = dVar22 * dVar26;
          dStack_1c0 = auVar4._8_8_;
          dStack_240 = auVar7._8_8_;
          dVar26 = dVar16 * dVar14 -
                   (((dVar20 - dVar11 * dVar17) - dVar17 * dVar14) - dVar11 * dVar16);
          dVar17 = dVar23 * dVar19 -
                   (((dVar22 - dStack_1c0 * dStack_240) - dStack_240 * dVar19) - dStack_1c0 * dVar23
                   );
          dVar24 = dVar26 - dVar17;
          dVar28 = dVar20 + dVar24;
          dVar11 = (dVar20 - (dVar28 - (dVar28 - dVar20))) + (dVar24 - (dVar28 - dVar20));
          dVar20 = dVar11 - dVar22;
          local_168 = (dVar26 - (dVar24 + (dVar26 - dVar24))) + ((dVar26 - dVar24) - dVar17);
          dStack_160 = (dVar11 - (dVar20 + (dVar11 - dVar20))) + ((dVar11 - dVar20) - dVar22);
          dStack_150 = dVar28 + dVar20;
          local_158 = (dVar28 - (dStack_150 - (dStack_150 - dVar28))) +
                      (dVar20 - (dStack_150 - dVar28));
          iVar9 = fast_expansion_sum_zeroelim(iVar9,C2,4,&local_168,D);
          dVar11 = D[(long)iVar9 + -1];
        }
      }
    }
  }
  return dVar11;
}

Assistant:

REAL orient2dadapt(REAL *pa, REAL *pb, REAL *pc, REAL detsum)
{
  INEXACT REAL acx, acy, bcx, bcy;
  REAL acxtail, acytail, bcxtail, bcytail;
  INEXACT REAL detleft, detright;
  REAL detlefttail, detrighttail;
  REAL det, errbound;
  REAL B[4], C1[8], C2[12], D[16];
  INEXACT REAL B3;
  int C1length, C2length, Dlength;
  REAL u[4];
  INEXACT REAL u3;
  INEXACT REAL s1, t1;
  REAL s0, t0;

  INEXACT REAL bvirt;
  REAL avirt, bround, around;
  INEXACT REAL c;
  INEXACT REAL abig;
  REAL ahi, alo, bhi, blo;
  REAL err1, err2, err3;
  INEXACT REAL _i, _j;
  REAL _0;

  acx = (REAL) (pa[0] - pc[0]);
  bcx = (REAL) (pb[0] - pc[0]);
  acy = (REAL) (pa[1] - pc[1]);
  bcy = (REAL) (pb[1] - pc[1]);

  Two_Product(acx, bcy, detleft, detlefttail);
  Two_Product(acy, bcx, detright, detrighttail);

  Two_Two_Diff(detleft, detlefttail, detright, detrighttail,
               B3, B[2], B[1], B[0]);
  B[3] = B3;

  det = estimate(4, B);
  errbound = ccwerrboundB * detsum;
  if ((det >= errbound) || (-det >= errbound)) {
    return det;
  }

  Two_Diff_Tail(pa[0], pc[0], acx, acxtail);
  Two_Diff_Tail(pb[0], pc[0], bcx, bcxtail);
  Two_Diff_Tail(pa[1], pc[1], acy, acytail);
  Two_Diff_Tail(pb[1], pc[1], bcy, bcytail);

  if ((acxtail == 0.0) && (acytail == 0.0)
      && (bcxtail == 0.0) && (bcytail == 0.0)) {
    return det;
  }

  errbound = ccwerrboundC * detsum + resulterrbound * Absolute(det);
  det += (acx * bcytail + bcy * acxtail)
       - (acy * bcxtail + bcx * acytail);
  if ((det >= errbound) || (-det >= errbound)) {
    return det;
  }

  Two_Product(acxtail, bcy, s1, s0);
  Two_Product(acytail, bcx, t1, t0);
  Two_Two_Diff(s1, s0, t1, t0, u3, u[2], u[1], u[0]);
  u[3] = u3;
  C1length = fast_expansion_sum_zeroelim(4, B, 4, u, C1);

  Two_Product(acx, bcytail, s1, s0);
  Two_Product(acy, bcxtail, t1, t0);
  Two_Two_Diff(s1, s0, t1, t0, u3, u[2], u[1], u[0]);
  u[3] = u3;
  C2length = fast_expansion_sum_zeroelim(C1length, C1, 4, u, C2);

  Two_Product(acxtail, bcytail, s1, s0);
  Two_Product(acytail, bcxtail, t1, t0);
  Two_Two_Diff(s1, s0, t1, t0, u3, u[2], u[1], u[0]);
  u[3] = u3;
  Dlength = fast_expansion_sum_zeroelim(C2length, C2, 4, u, D);

  return(D[Dlength - 1]);
}